

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void mbedtls_ssl_handshake_wrapup(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_session *pmVar1;
  _func_int_void_ptr_mbedtls_ssl_session_ptr *p_Var2;
  int iVar3;
  
  iVar3 = ssl->handshake->resume;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x1369,"=> handshake wrapup");
  if (ssl->renego_status == 1) {
    ssl->renego_status = 2;
    ssl->renego_records_seen = 0;
  }
  pmVar1 = ssl->session;
  if (pmVar1 != (mbedtls_ssl_session *)0x0) {
    ssl->session_negotiate->encrypt_then_mac = pmVar1->encrypt_then_mac;
    mbedtls_ssl_session_free(pmVar1);
    free(ssl->session);
  }
  pmVar1 = ssl->session_negotiate;
  ssl->session = pmVar1;
  ssl->session_negotiate = (mbedtls_ssl_session *)0x0;
  p_Var2 = ssl->conf->f_set_cache;
  if (((p_Var2 != (_func_int_void_ptr_mbedtls_ssl_session_ptr *)0x0) && (pmVar1->id_len != 0)) &&
     (iVar3 == 0)) {
    iVar3 = (*p_Var2)(ssl->conf->p_cache,pmVar1);
    if (iVar3 != 0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x138c,"cache did not store session");
    }
  }
  if (((ssl->conf->field_0x174 & 2) == 0) ||
     (ssl->handshake->flight == (mbedtls_ssl_flight_item *)0x0)) {
    ssl_handshake_wrapup_free_hs_transform(ssl);
  }
  else {
    ssl_set_timer(ssl,0);
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x1398,"skip freeing handshake and transform");
  }
  ssl->state = ssl->state + 1;
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x13a0,"<= handshake wrapup");
  return;
}

Assistant:

void mbedtls_ssl_handshake_wrapup( mbedtls_ssl_context *ssl )
{
    int resume = ssl->handshake->resume;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "=> handshake wrapup" ) );

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    if( ssl->renego_status == MBEDTLS_SSL_RENEGOTIATION_IN_PROGRESS )
    {
        ssl->renego_status =  MBEDTLS_SSL_RENEGOTIATION_DONE;
        ssl->renego_records_seen = 0;
    }
#endif

    /*
     * Free the previous session and switch in the current one
     */
    if( ssl->session )
    {
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
        /* RFC 7366 3.1: keep the EtM state */
        ssl->session_negotiate->encrypt_then_mac =
                  ssl->session->encrypt_then_mac;
#endif

        mbedtls_ssl_session_free( ssl->session );
        mbedtls_free( ssl->session );
    }
    ssl->session = ssl->session_negotiate;
    ssl->session_negotiate = NULL;

    /*
     * Add cache entry
     */
    if( ssl->conf->f_set_cache != NULL &&
        ssl->session->id_len != 0 &&
        resume == 0 )
    {
        if( ssl->conf->f_set_cache( ssl->conf->p_cache, ssl->session ) != 0 )
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "cache did not store session" ) );
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake->flight != NULL )
    {
        /* Cancel handshake timer */
        ssl_set_timer( ssl, 0 );

        /* Keep last flight around in case we need to resend it:
         * we need the handshake and transform structures for that */
        MBEDTLS_SSL_DEBUG_MSG( 3, ( "skip freeing handshake and transform" ) );
    }
    else
#endif
        ssl_handshake_wrapup_free_hs_transform( ssl );

    ssl->state++;

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "<= handshake wrapup" ) );
}